

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall kratos::RemoveEmptyBlockVisitor::visit(RemoveEmptyBlockVisitor *this,Generator *top)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer psVar2;
  shared_ptr<kratos::Stmt> *stmt_1;
  size_type sVar3;
  undefined1 stmt_00 [8];
  undefined1 local_88 [8];
  shared_ptr<kratos::Stmt> stmt;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> local_68;
  size_type local_58;
  undefined1 local_50 [8];
  undefined1 auStack_48 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  
  local_58 = (long)(top->stmts_).
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(top->stmts_).
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_48 = (undefined1  [8])0x0;
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50 = (undefined1  [8])this;
  for (sVar3 = 0;
      psVar2 = stmts_to_remove.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start, stmt_00 = auStack_48, local_58 != sVar3;
      sVar3 = sVar3 + 1) {
    Generator::get_stmt((Generator *)local_88,(uint32_t)top);
    std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,(__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_88);
    dispatch_node((RemoveEmptyBlockVisitor *)
                  &stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  (shared_ptr<kratos::Stmt> *)local_50);
    _Var1 = stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    if (_Var1._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
      emplace_back<std::shared_ptr<kratos::Stmt>&>
                ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                  *)auStack_48,(shared_ptr<kratos::Stmt> *)local_88);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  }
  for (; stmt_00 != (undefined1  [8])psVar2; stmt_00 = (undefined1  [8])((long)stmt_00 + 0x10)) {
    Generator::remove_stmt(top,(shared_ptr<kratos::Stmt> *)stmt_00);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          auStack_48);
  return;
}

Assistant:

void visit(Generator* top) override {
        auto stmt_count = top->stmts_count();
        std::vector<std::shared_ptr<Stmt>> stmts_to_remove;
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = top->get_stmt(i);
            if (!dispatch_node(stmt)) stmts_to_remove.emplace_back(stmt);
        }
        for (auto const& stmt : stmts_to_remove) {
            top->remove_stmt(stmt);
        }
    }